

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

TheoryElement * __thiscall Potassco::TheoryData::getElement(TheoryData *this,Id_t id)

{
  Data *pDVar1;
  
  pDVar1 = this->data_;
  if (id < (uint)((pDVar1->elems).top >> 3)) {
    pDVar1 = *(Data **)((long)(pDVar1->elems).mem.beg_ + (ulong)id * 8);
    if (pDVar1 != (Data *)0x0) {
      return (TheoryElement *)pDVar1;
    }
  }
  fail(-2,"const TheoryElement &Potassco::TheoryData::getElement(Id_t) const",0x149,"hasElement(id)"
       ,"Unknown element \'%u\'",(ulong)id,(ulong)pDVar1 & 0xffffffff00000000);
}

Assistant:

const TheoryElement& TheoryData::getElement(Id_t id) const {
	POTASSCO_REQUIRE(hasElement(id), "Unknown element '%u'", unsigned(id));
	return *elems()[id];
}